

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderFps(CHud *this)

{
  long lVar1;
  ITextRender *pIVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  float fVar5;
  char aBuf [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_CComponent).m_pClient)->m_pConfig->m_ClShowfps != 0) {
    if (RenderFps()::s_Cursor == '\0') {
      iVar3 = __cxa_guard_acquire(&RenderFps()::s_Cursor);
      if (iVar3 != 0) {
        CTextCursor::CTextCursor(&RenderFps::s_Cursor,12.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderFps::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderFps()::s_Cursor);
      }
    }
    RenderFps::s_Cursor.m_Align = 2;
    RenderFps::s_Cursor.m_CursorPos.field_0.x = this->m_Width + -10.0;
    RenderFps::s_Cursor.m_CursorPos.field_1.y = 5.0;
    auVar4._4_4_ = this->m_AverageFPS;
    auVar4._0_4_ = ((this->super_CComponent).m_pClient)->m_pClient->m_RenderFrameTime;
    auVar4._8_8_ = 0;
    auVar4 = divps(_DAT_001c8b60,auVar4);
    fVar5 = (1.0 - auVar4._4_4_) * this->m_AverageFPS + auVar4._4_4_ * auVar4._0_4_;
    this->m_AverageFPS = fVar5;
    str_format(aBuf,0x20,"%d",(ulong)(uint)(int)fVar5);
    CTextCursor::Reset(&RenderFps::s_Cursor,-1);
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
              (pIVar2,&RenderFps::s_Cursor,aBuf,0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderFps()
{
	if(Config()->m_ClShowfps)
	{
		static CTextCursor s_Cursor(12);
		s_Cursor.m_Align = TEXTALIGN_RIGHT;
		s_Cursor.MoveTo(m_Width-10, 5);

		// calculate avg. fps
		float FPS = 1.0f / Client()->RenderFrameTime();
		m_AverageFPS = (m_AverageFPS*(1.0f-(1.0f/m_AverageFPS))) + (FPS*(1.0f/m_AverageFPS));
		char aBuf[32];
		str_format(aBuf, sizeof(aBuf), "%d", (int)m_AverageFPS);

		s_Cursor.Reset();
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
	}
}